

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitBlockExpression
          (MethodSemanticAnalysis *this,BlockExpression *node)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar4;
  Oop OVar5;
  SequenceNode *pSVar6;
  shared_ptr<Lodtalk::EvaluationScope> local_110;
  anon_union_8_4_0eb573b0_for_Oop_0 local_100;
  undefined1 local_f8 [8];
  TemporalVariableLookupPtr res_1;
  value_type *arg_1;
  size_t i_1;
  shared_ptr<Lodtalk::LocalScope> argumentScope_1;
  size_type argumentCount_1;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *arguments_1;
  LocalVariables oldLocalVariables;
  Node *oldLocalContext;
  shared_ptr<Lodtalk::EvaluationScope> local_90 [2];
  anon_union_8_4_0eb573b0_for_Oop_0 local_70;
  undefined1 local_68 [8];
  TemporalVariableLookupPtr res;
  value_type *arg;
  size_t i;
  shared_ptr<Lodtalk::LocalScope> argumentScope;
  size_type argumentCount;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *arguments;
  ArgumentList *argumentList;
  BlockExpression *node_local;
  MethodSemanticAnalysis *this_local;
  ArgumentList *this_00;
  
  iVar2 = (*(node->super_FunctionalNode).super_Node._vptr_Node[8])();
  this_00 = (ArgumentList *)CONCAT44(extraout_var,iVar2);
  uVar3 = (*(node->super_FunctionalNode).super_Node._vptr_Node[9])();
  if ((uVar3 & 1) == 0) {
    oldLocalVariables.
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this->localContext;
    this->localContext = (Node *)node;
    std::
    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ::vector((vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
              *)&arguments_1);
    std::
    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ::swap((vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            *)&arguments_1,&this->localVariables);
    if (this_00 != (ArgumentList *)0x0) {
      pvVar4 = AST::ArgumentList::getArguments(this_00);
      argumentScope_1.super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::size
                     (pvVar4);
      std::make_shared<Lodtalk::LocalScope,std::shared_ptr<Lodtalk::EvaluationScope>&>
                ((shared_ptr<Lodtalk::EvaluationScope> *)&i_1);
      for (arg_1 = (value_type *)0x0;
          arg_1 < argumentScope_1.
                  super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi; arg_1 = (value_type *)((long)arg_1 + 1)) {
        res_1.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::
             operator[](pvVar4,(size_type)arg_1);
        OVar5.field_0 =
             (anon_union_8_4_0eb573b0_for_Oop_0)
             std::__shared_ptr_access<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i_1);
        local_100 = (anon_union_8_4_0eb573b0_for_Oop_0)
                    AST::Argument::getSymbolOop
                              ((Argument *)
                               (res_1.
                                super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_vptr__Sp_counted_base);
        LocalScope::addArgument((LocalScope *)local_f8,OVar5,(Node *)local_100.header);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_f8);
        if (!bVar1) {
          AbstractASTVisitor::error
                    ((AbstractASTVisitor *)this,
                     (Node *)(res_1.
                              super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_vptr__Sp_counted_base,
                     "the argument has the same name as another argument.");
        }
        std::
        vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
        ::push_back(&this->localVariables,(value_type *)local_f8);
        std::shared_ptr<Lodtalk::TemporalVariableLookup>::~shared_ptr
                  ((shared_ptr<Lodtalk::TemporalVariableLookup> *)local_f8);
      }
      std::shared_ptr<Lodtalk::EvaluationScope>::shared_ptr<Lodtalk::LocalScope,void>
                (&local_110,(shared_ptr<Lodtalk::LocalScope> *)&i_1);
      ScopedInterpreter::pushScope(&this->super_ScopedInterpreter,&local_110);
      std::shared_ptr<Lodtalk::EvaluationScope>::~shared_ptr(&local_110);
      std::shared_ptr<Lodtalk::LocalScope>::~shared_ptr((shared_ptr<Lodtalk::LocalScope> *)&i_1);
    }
    pSVar6 = AST::BlockExpression::getBody(node);
    (*(pSVar6->super_Node)._vptr_Node[2])(pSVar6,this);
    if (this_00 != (ArgumentList *)0x0) {
      ScopedInterpreter::popScope(&this->super_ScopedInterpreter);
    }
    AST::FunctionalNode::setLocalVariables(&node->super_FunctionalNode,&this->localVariables);
    this->localContext =
         (Node *)oldLocalVariables.
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ::swap((vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            *)&arguments_1,&this->localVariables);
    Oop::Oop((Oop *)&this_local);
    std::
    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ::~vector((vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
               *)&arguments_1);
  }
  else {
    if (this_00 != (ArgumentList *)0x0) {
      pvVar4 = AST::ArgumentList::getArguments(this_00);
      argumentScope.super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::size
                        (pvVar4);
      std::make_shared<Lodtalk::LocalScope,std::shared_ptr<Lodtalk::EvaluationScope>&>
                ((shared_ptr<Lodtalk::EvaluationScope> *)&i);
      for (arg = (value_type *)0x0;
          arg < argumentScope.super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi; arg = (value_type *)((long)arg + 1)) {
        res.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::
             operator[](pvVar4,(size_type)arg);
        OVar5.field_0 =
             (anon_union_8_4_0eb573b0_for_Oop_0)
             std::__shared_ptr_access<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
        local_70 = (anon_union_8_4_0eb573b0_for_Oop_0)
                   AST::Argument::getSymbolOop
                             ((Argument *)
                              (res.
                               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_vptr__Sp_counted_base);
        LocalScope::addArgument((LocalScope *)local_68,OVar5,(Node *)local_70.header);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
        if (!bVar1) {
          AbstractASTVisitor::error
                    ((AbstractASTVisitor *)this,
                     (Node *)(res.
                              super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_vptr__Sp_counted_base,
                     "the argument has the same name as another argument.");
        }
        AST::BlockExpression::addInlineArgument(node,(TemporalVariableLookupPtr *)local_68);
        std::
        vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
        ::push_back(&this->localVariables,(value_type *)local_68);
        std::shared_ptr<Lodtalk::TemporalVariableLookup>::~shared_ptr
                  ((shared_ptr<Lodtalk::TemporalVariableLookup> *)local_68);
      }
      std::shared_ptr<Lodtalk::EvaluationScope>::shared_ptr<Lodtalk::LocalScope,void>
                (local_90,(shared_ptr<Lodtalk::LocalScope> *)&i);
      ScopedInterpreter::pushScope(&this->super_ScopedInterpreter,local_90);
      std::shared_ptr<Lodtalk::EvaluationScope>::~shared_ptr(local_90);
      std::shared_ptr<Lodtalk::LocalScope>::~shared_ptr((shared_ptr<Lodtalk::LocalScope> *)&i);
    }
    pSVar6 = AST::BlockExpression::getBody(node);
    (*(pSVar6->super_Node)._vptr_Node[2])(pSVar6,this);
    if (this_00 != (ArgumentList *)0x0) {
      ScopedInterpreter::popScope(&this->super_ScopedInterpreter);
    }
    Oop::Oop((Oop *)&this_local);
  }
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodSemanticAnalysis::visitBlockExpression(BlockExpression *node)
{
    auto argumentList = node->getArgumentList();

    if(node->isInlined())
    {
        if(argumentList)
        {
            auto &arguments = argumentList->getArguments();
            auto argumentCount = arguments.size();

            // Create the arguments scope.
            auto argumentScope = std::make_shared<LocalScope> (currentScope);
            for(size_t i = 0; i < argumentCount; ++i)
            {
                auto &arg = arguments[i];
                auto res = argumentScope->addArgument(arg->getSymbolOop(), localContext);
                if(!res)
                    error(arg, "the argument has the same name as another argument.");
                node->addInlineArgument(res);
                localVariables.push_back(res);
            }

            pushScope(argumentScope);
        }

        // Visit the method body
        node->getBody()->acceptVisitor(this);

        if(argumentList)
            popScope();
        return Oop();
    }

    // Store the local context.
    auto oldLocalContext = localContext;
    localContext = node;
    FunctionalNode::LocalVariables oldLocalVariables;
    oldLocalVariables.swap(localVariables);

    // Process the arguments
	if(argumentList)
	{
		auto &arguments = argumentList->getArguments();
        auto argumentCount = arguments.size();

		// Create the arguments scope.
		auto argumentScope = std::make_shared<LocalScope> (currentScope);
		for(size_t i = 0; i < argumentCount; ++i)
		{
			auto &arg = arguments[i];
			auto res = argumentScope->addArgument(arg->getSymbolOop(), localContext);
			if(!res)
				error(arg, "the argument has the same name as another argument.");
            localVariables.push_back(res);
		}

		pushScope(argumentScope);
	}

    // Visit the method body
	node->getBody()->acceptVisitor(this);

	if(argumentList)
		popScope();

    // Store the block local variables.
    node->setLocalVariables(localVariables);

    // Restore the local context.
    localContext = oldLocalContext;
    oldLocalVariables.swap(localVariables);

    return Oop();
}